

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

void InitVector(Vector *V,int sz)

{
  ostream *this;
  int sz_local;
  Vector *V_local;
  
  if (sz < 1) {
    this = std::operator<<((ostream *)&std::cout,"Invalid Array Size!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    V->ArraySize = sz;
    V->VectorLength = 0;
    GetArray(V);
  }
  return;
}

Assistant:

void InitVector(Vector *V,int sz)  //初始化空向量，建立一个最大长度为sz的数组
{
    if(sz <= 0)
        cout << "Invalid Array Size!" << endl;
    else
    {
        V->ArraySize = sz;
        V->VectorLength = 0;
        GetArray(V);
    }
}